

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O3

ostream * std::operator<<(ostream *os,vector<int,_std::allocator<int>_> *vec)

{
  int *piVar1;
  ostream *poVar2;
  int *item;
  int *piVar3;
  
  piVar1 = (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar3 = (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(os,*piVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& vec)
{
  for (auto const& item : vec)
  {
    os << item << ", ";
  }
  return os;
}